

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prompt.c
# Opt level: O2

kp_error_t kp_readpass(kp_ctx *ctx,_Bool confirm,char *password,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  long lVar2;
  char *__s2;
  int *piVar3;
  char *fmt_00;
  kp_error_t kVar4;
  char *prompt;
  char *prompt_fmt;
  
  prompt_fmt = (char *)0x0;
  prompt = (char *)0x0;
  iVar1 = __asprintf_chk(&prompt_fmt,1,"[kickpass] %s password: ");
  if (iVar1 < 0) {
    kp_err(5,"cannot build prompt");
  }
  iVar1 = __vasprintf_chk(&prompt,1,prompt_fmt,ap);
  if (iVar1 < 0) {
    kp_err(5,"cannot build prompt");
  }
  lVar2 = readpassphrase(prompt,password,0x1000,2);
  if (lVar2 == 0) {
    fmt_00 = "cannot read password";
LAB_0010528f:
    __s2 = (char *)0x0;
  }
  else {
    kVar4 = 0;
    if (!confirm) {
      __s2 = (char *)0x0;
      goto LAB_001052a0;
    }
    __s2 = (char *)sodium_malloc(0x1000);
    if (__s2 == (char *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0xc;
      fmt_00 = "memory error";
      goto LAB_0010528f;
    }
    lVar2 = readpassphrase("[kickpass] confirm: ",__s2,0x1000,2);
    if (lVar2 != 0) {
      iVar1 = strncmp(password,__s2,0x1000);
      kVar4 = 0;
      if (iVar1 != 0) {
        kp_warn(2,"mismatching password");
        kVar4 = 2;
      }
      goto LAB_001052a0;
    }
    fmt_00 = "cannot read password";
  }
  kVar4 = 5;
  kp_warn(5,fmt_00);
LAB_001052a0:
  free(prompt_fmt);
  free(prompt);
  sodium_free(__s2);
  return kVar4;
}

Assistant:

kp_error_t
kp_readpass(struct kp_ctx *ctx, bool confirm, char *password, const char *fmt, va_list ap)
{
	kp_error_t ret = KP_SUCCESS;
	char *prompt_fmt = NULL, *prompt = NULL;
	char *confirmation = NULL;

	assert(fmt);
	assert(password);

	if (asprintf(&prompt_fmt, PASSWORD_PROMPT, fmt) < 0) {
		kp_err(KP_ERRNO, "cannot build prompt");
	}

	if (vasprintf(&prompt, prompt_fmt, ap) < 0) {
		kp_err(KP_ERRNO, "cannot build prompt");
	}

	if (readpassphrase(prompt, password, KP_PASSWORD_MAX_LEN,
				RPP_ECHO_OFF | RPP_REQUIRE_TTY) == NULL) {
		ret = KP_ERRNO;
		kp_warn(ret, "cannot read password");
		goto out;
	}

	if (confirm) {
		confirmation = sodium_malloc(KP_PASSWORD_MAX_LEN);
		if (!confirmation) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		if (readpassphrase(PASSWORD_CONFIRM_PROMPT, confirmation,
					KP_PASSWORD_MAX_LEN,
					RPP_ECHO_OFF | RPP_REQUIRE_TTY)
				== NULL) {
			ret = KP_ERRNO;
			kp_warn(ret, "cannot read password");
			goto out;
		}

		if (strncmp(password, confirmation, KP_PASSWORD_MAX_LEN) != 0) {
			ret = KP_EINPUT;
			kp_warn(ret, "mismatching password");
			goto out;
		}
	}

out:
	free(prompt_fmt);
	free(prompt);
	sodium_free(confirmation);

	return ret;
}